

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

void __thiscall Matrix::Matrix(Matrix *this,int i)

{
  int *piVar1;
  allocator<char> local_21;
  
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_00155750;
  (this->matrixParent).px = (double *)0x0;
  (this->matrixParent).pn.pi_ = (sp_counted_base *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->sMatrixName,"data",&local_21);
  this->nMatrixDimension = 1;
  piVar1 = (int *)operator_new__(4);
  this->pSize = piVar1;
  *piVar1 = i;
  this->bReference = false;
  init(this,(EVP_PKEY_CTX *)0x1);
  return;
}

Assistant:

Matrix::Matrix(int i) : sMatrixName("data") 
 { 
	nMatrixDimension = 1;
	pSize = new int[nMatrixDimension];
	pSize[0] = i;
	bReference = false;
	init();
}